

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoordCalc.cpp
# Opt level: O1

positionTy * __thiscall positionTy::operator|=(positionTy *this,positionTy *pos)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  int iVar7;
  positionTy *ppVar8;
  LTError *this_00;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  
  if ((((ushort)pos->f ^ (ushort)this->f) & 0xc00) == 0) {
    dVar9 = HeadingAvg(this->_head,pos->_head,(double)this->mergeCount,(double)pos->mergeCount);
    dVar1 = pos->_alt;
    dVar2 = this->_roll;
    dVar10 = (double)this->mergeCount;
    dVar3 = pos->_roll;
    dVar5 = this->_alt;
    dVar6 = this->_pitch;
    dVar4 = pos->_pitch;
    this->_lat = this->_lat * dVar10;
    this->_lon = this->_lon * dVar10;
    this->_alt = dVar5 * dVar10;
    this->_ts = this->_ts * dVar10;
    this->_head = dVar10 * this->_head;
    this->_pitch = dVar10 * dVar6;
    this->_roll = dVar10 * dVar2;
    operator+=(this,pos);
    iVar7 = this->mergeCount + 1;
    this->mergeCount = iVar7;
    dVar10 = 1.0 / (double)iVar7;
    this->_lat = this->_lat * dVar10;
    this->_lon = this->_lon * dVar10;
    dVar12 = this->_alt * dVar10;
    this->_alt = dVar12;
    this->_ts = this->_ts * dVar10;
    dVar11 = this->_pitch * dVar10;
    this->_head = this->_head * dVar10;
    this->_pitch = dVar11;
    dVar10 = dVar10 * this->_roll;
    this->_roll = dVar10;
    this->_head = dVar9;
    if (NAN(dVar12)) {
      this->_alt = (double)(~-(ulong)NAN(dVar5) & (ulong)dVar5 | (ulong)dVar1 & -(ulong)NAN(dVar5));
    }
    if (NAN(dVar11)) {
      this->_pitch = (double)(~-(ulong)NAN(dVar6) & (ulong)dVar6 | (ulong)dVar4 & -(ulong)NAN(dVar6)
                             );
    }
    if (NAN(dVar10)) {
      this->_roll = (double)(~-(ulong)NAN(dVar2) & (ulong)dVar2 | (ulong)dVar3 & -(ulong)NAN(dVar2))
      ;
    }
    if (((ushort)this->f & 0x7f) == 0) {
      this->f = (posFlagsTy)((ushort)this->f | (ushort)pos->f & 0x7f);
    }
    if ((((ushort)pos->f ^ (ushort)this->f) & 0x300) != 0) {
      this->f = (posFlagsTy)((ushort)this->f & 0xfcff);
    }
    this->f = (posFlagsTy)((ushort)this->f & 0x8f7f);
    this->edgeIdx = 0xffffffffffffffff;
    ppVar8 = normalize(this);
    return ppVar8;
  }
  this_00 = (LTError *)__cxa_allocate_exception(0x18);
  LTError::LTError(this_00,
                   "/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/CoordCalc.cpp"
                   ,0x134,"operator|=",logFATAL,"ASSERT FAILED: %s",
                   "f.unitCoord == pos.f.unitCoord && f.unitAngle == pos.f.unitAngle");
  __cxa_throw(this_00,&LTError::typeinfo,std::logic_error::~logic_error);
}

Assistant:

positionTy& positionTy::operator |= (const positionTy& pos)
{
    LOG_ASSERT(f.unitCoord == pos.f.unitCoord && f.unitAngle == pos.f.unitAngle);
    // heading needs special treatment
    // (also removes nan value if one of the headings is nan)
    const double h = HeadingAvg(heading(), pos.heading(), mergeCount, pos.mergeCount);
    // take into account how many other objects made up the current pos! ("* count")

    // Special handling for possible NAN values: If NAN on either side then the other wins
    double prev_alt = std::isnan(alt_m()) ? pos.alt_m() : alt_m();
    double prev_ptc = std::isnan(pitch()) ? pos.pitch() : pitch();
    double prev_rol = std::isnan(roll())  ? pos.roll()  : roll();

	// previous implementation:    v = (v * mergeCount + pos.v) / (mergeCount+1);
    (*this *= mergeCount) += pos;
    ++mergeCount;
    *this *= 1.0 / mergeCount;

    heading() = h;
    
    // Handle NAN cases
    if (std::isnan(alt_m())) alt_m() = prev_alt;
    if (std::isnan(pitch())) pitch() = prev_ptc;
    if (std::isnan(roll()))  roll()  = prev_rol;

    // any special flight phase? shall survive
    // (if both pos have special flight phases then ours survives)
    if (!f.flightPhase)
        f.flightPhase = pos.f.flightPhase;
    
    // ground status: if different, then the new one is likely off ground,
    //                but we have it determined soon
    if (f.onGrnd != pos.f.onGrnd)
        f.onGrnd = GND_UNKNOWN;       // IsOnGnd() will return false for this!
    
    // Special Pos and other location flags need to be re-evaluated
    f.bHeadFixed = false;
    f.specialPos = SPOS_NONE;
    f.bCutCorner = false;
    edgeIdx      = EDGE_UNKNOWN;
    
    return normalize();
}